

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_SetCommand(cmsysProcess *cp,char **command)

{
  char **local_30;
  char **c;
  int i;
  char **command_local;
  cmsysProcess *cp_local;
  
  if (cp == (cmsysProcess *)0x0) {
    cp_local._4_4_ = 0;
  }
  else {
    for (c._4_4_ = 0; c._4_4_ < cp->NumberOfCommands; c._4_4_ = c._4_4_ + 1) {
      local_30 = cp->Commands[c._4_4_];
      while (*local_30 != (char *)0x0) {
        free(*local_30);
        local_30 = local_30 + 1;
      }
      free(cp->Commands[c._4_4_]);
    }
    cp->NumberOfCommands = 0;
    if (cp->Commands != (char ***)0x0) {
      free(cp->Commands);
      cp->Commands = (char ***)0x0;
    }
    if (command == (char **)0x0) {
      cp_local._4_4_ = 1;
    }
    else {
      cp_local._4_4_ = cmsysProcess_AddCommand(cp,command);
    }
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_SetCommand(kwsysProcess* cp, char const* const* command)
{
  int i;
  if(!cp)
    {
    return 0;
    }
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    char** c = cp->Commands[i];
    while(*c)
      {
      free(*c++);
      }
    free(cp->Commands[i]);
    }
  cp->NumberOfCommands = 0;
  if(cp->Commands)
    {
    free(cp->Commands);
    cp->Commands = 0;
    }
  if(command)
    {
    return kwsysProcess_AddCommand(cp, command);
    }
  return 1;
}